

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O3

bool QGifHandler::canRead(QIODevice *device)

{
  long lVar1;
  long in_FS_OFFSET;
  bool bVar2;
  int local_10;
  short local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    lcGif();
    if (((byte)lcGif::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      canRead();
    }
  }
  else {
    local_c = -0x5556;
    local_10 = -0x55555556;
    lVar1 = QIODevice::peek((char *)device,(longlong)&local_10);
    if (lVar1 == 6) {
      if (local_c == 0x6137 && local_10 == 0x38464947) {
        bVar2 = true;
      }
      else {
        bVar2 = local_c == 0x6139 && local_10 == 0x38464947;
      }
      goto LAB_001051c9;
    }
  }
  bVar2 = false;
LAB_001051c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QGifHandler::canRead(QIODevice *device)
{
    if (!device) {
        qCWarning(lcGif, "QGifHandler::canRead() called with no device");
        return false;
    }

    char head[6];
    if (device->peek(head, sizeof(head)) == sizeof(head))
        return qstrncmp(head, "GIF87a", 6) == 0
            || qstrncmp(head, "GIF89a", 6) == 0;
    return false;
}